

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

void __thiscall
glcts::ViewportArray::ScissorTestStateAPI::compareScissorTestStates
          (ScissorTestStateAPI *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *left,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *right,GLchar *description,
          bool *out_result)

{
  pointer puVar1;
  size_t sVar2;
  ulong uVar3;
  uchar local_1c1;
  bool *local_1c0;
  ScissorTestStateAPI *local_1b8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  puVar1 = (left->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((left->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    uVar3 = 0;
    local_1c0 = out_result;
    local_1b8 = this;
    do {
      if (puVar1[uVar3] !=
          (right->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar3]) {
        local_1b0 = (undefined1  [8])((local_1b8->super_TestCaseBase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Test case: ",0xb);
        if (description == (GLchar *)0x0) {
          std::ios::clear((int)local_1a8[-3] + (int)(ostringstream *)&local_1a8);
        }
        else {
          sVar2 = strlen(description);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,description,sVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8," Invalid values [",0x11);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"] ",2);
        local_1c1 = (left->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar3];
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,(char *)&local_1c1,1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
        local_1c1 = (right->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar3];
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,(char *)&local_1c1,1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        *local_1c0 = false;
      }
      uVar3 = uVar3 + 1;
      puVar1 = (left->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(left->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1));
  }
  return;
}

Assistant:

void ScissorTestStateAPI::compareScissorTestStates(std::vector<GLboolean>& left, std::vector<GLboolean>& right,
												   const GLchar* description, bool& out_result)
{
	for (size_t i = 0; i < left.size(); ++i)
	{
		if (left[i] != right[i])
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << description
												<< " Invalid values [" << i << "] " << left[i] << " " << right[i]
												<< tcu::TestLog::EndMessage;

			out_result = false;
		}
	}
}